

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::~CGUIListBox(CGUIListBox *this)

{
  CGUIListBox *in_stack_00000010;
  
  ~CGUIListBox(in_stack_00000010);
  return;
}

Assistant:

CGUIListBox::~CGUIListBox()
{
	if (ScrollBar)
		ScrollBar->drop();

	if (Font)
		Font->drop();

	if (IconBank)
		IconBank->drop();
}